

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_write_utf8(mpack_writer_t *writer,char *str,uint32_t length)

{
  _Bool _Var1;
  uint32_t length_local;
  char *str_local;
  mpack_writer_t *writer_local;
  
  _Var1 = mpack_utf8_check(str,(ulong)length);
  if (_Var1) {
    mpack_write_str(writer,str,length);
  }
  else {
    mpack_writer_flag_error(writer,mpack_error_invalid);
  }
  return;
}

Assistant:

void mpack_write_utf8(mpack_writer_t* writer, const char* str, uint32_t length) {
    mpack_assert(str != NULL, "data for string of length %i is NULL", (int)length);
    if (!mpack_utf8_check(str, length)) {
        mpack_writer_flag_error(writer, mpack_error_invalid);
        return;
    }
    mpack_write_str(writer, str, length);
}